

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_compare.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *progname_00;
  int iVar1;
  int iVar2;
  char **ppcVar3;
  char *progname;
  int flags;
  int result;
  int ch;
  char **argv_local;
  int argc_local;
  
  progname._4_4_ = 0;
  progname_00 = *argv;
  while( true ) {
    iVar1 = getopt(argc,argv,"pahv");
    if (iVar1 == -1) {
      ppcVar3 = argv + _optind;
      if (argc - _optind == 2) {
        iVar1 = version_compare4(*ppcVar3,ppcVar3[1],progname._4_4_,progname._4_4_);
        if (iVar1 < 0) {
          printf("<\n");
        }
        else if (iVar1 < 1) {
          printf("=\n");
        }
        else {
          printf(">\n");
        }
        return 0;
      }
      if (argc - _optind == 3) {
        iVar1 = version_compare4(*ppcVar3,ppcVar3[2],progname._4_4_,progname._4_4_);
        iVar2 = streq(ppcVar3[1],"<");
        if ((iVar2 != 0) || (iVar2 = streq(ppcVar3[1],"lt"), iVar2 != 0)) {
          return (uint)((iVar1 < 0 ^ 0xffU) & 1);
        }
        iVar2 = streq(ppcVar3[1],"<=");
        if (((iVar2 != 0) || (iVar2 = streq(ppcVar3[1],"=<"), iVar2 != 0)) ||
           (iVar2 = streq(ppcVar3[1],"le"), iVar2 != 0)) {
          return (uint)((iVar1 < 1 ^ 0xffU) & 1);
        }
        iVar2 = streq(ppcVar3[1],"=");
        if (((iVar2 != 0) || (iVar2 = streq(ppcVar3[1],"="), iVar2 != 0)) ||
           (iVar2 = streq(ppcVar3[1],"eq"), iVar2 != 0)) {
          return (uint)((iVar1 == 0 ^ 0xffU) & 1);
        }
        iVar2 = streq(ppcVar3[1],">=");
        if (((iVar2 != 0) || (iVar2 = streq(ppcVar3[1],"=>"), iVar2 != 0)) ||
           (iVar2 = streq(ppcVar3[1],"ge"), iVar2 != 0)) {
          return (uint)((-1 < iVar1 ^ 0xffU) & 1);
        }
        iVar2 = streq(ppcVar3[1],">");
        if ((iVar2 != 0) || (iVar2 = streq(ppcVar3[1],"gt"), iVar2 != 0)) {
          return (uint)((0 < iVar1 ^ 0xffU) & 1);
        }
      }
      print_usage(progname_00);
      return 1;
    }
    if (iVar1 == 0x3f) break;
    if (iVar1 == 0x61) {
      progname._4_4_ = progname._4_4_ | 2;
    }
    else {
      if (iVar1 == 0x68) break;
      if (iVar1 != 0x70) {
        if (iVar1 != 0x76) {
          print_usage(progname_00);
          return 1;
        }
        print_version();
        return 0;
      }
      progname._4_4_ = progname._4_4_ | 1;
    }
  }
  print_usage(progname_00);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	int ch, result, flags = 0;
	const char* progname = argv[0];

	while ((ch = getopt(argc, argv, "pahv")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'v':
			print_version();
			return 0;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	if (argc == 2) {
		result = version_compare4(argv[0], argv[1], flags, flags);

		if (result < 0)
			printf("<\n");
		else if (result > 0)
			printf(">\n");
		else
			printf("=\n");

		return 0;
	} else if (argc == 3) {
		result = version_compare4(argv[0], argv[2], flags, flags);

		if (streq(argv[1], "<") || streq(argv[1], "lt"))
			return !(result < 0);
		else if (streq(argv[1], "<=") || streq(argv[1], "=<") || streq(argv[1], "le"))
			return !(result <= 0);
		else if (streq(argv[1], "=") || streq(argv[1], "=") || streq(argv[1], "eq"))
			return !(result == 0);
		else if (streq(argv[1], ">=") || streq(argv[1], "=>") || streq(argv[1], "ge"))
			return !(result >= 0);
		else if (streq(argv[1], ">") || streq(argv[1], "gt"))
			return !(result > 0);
	}

	print_usage(progname);
	return 1;
}